

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingRenderCase::~LayoutBindingRenderCase
          (LayoutBindingRenderCase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

LayoutBindingRenderCase::~LayoutBindingRenderCase (void)
{
	deinit();
}